

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateSymbolName
          (DescriptorBuilder *this,string *name,string *full_name,Message *proto)

{
  Message *descriptor;
  Message *element_name;
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  Message *pMStack_28;
  int i;
  Message *proto_local;
  string *full_name_local;
  string *name_local;
  DescriptorBuilder *this_local;
  
  pMStack_28 = proto;
  proto_local = (Message *)full_name;
  full_name_local = name;
  name_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    for (local_2c = 0; uVar1 = (ulong)local_2c, uVar2 = std::__cxx11::string::size(), uVar1 < uVar2;
        local_2c = local_2c + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local);
      if ((((*pcVar3 < 'a') ||
           (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local), 'z' < *pcVar3
           )) && ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local),
                  *pcVar3 < 'A' ||
                  (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local),
                  'Z' < *pcVar3)))) &&
         (((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local), *pcVar3 < '0'
           || (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local),
              '9' < *pcVar3)) &&
          (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local),
          element_name = proto_local, descriptor = pMStack_28, *pcVar3 != '_')))) {
        std::operator+(&local_70,"\"",full_name_local);
        std::operator+(&local_50,&local_70,"\" is not a valid identifier.");
        AddError(this,(string *)element_name,descriptor,NAME,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  else {
    AddError(this,(string *)proto_local,pMStack_28,NAME,"Missing name.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateSymbolName(
    const string& name, const string& full_name, const Message& proto) {
  if (name.empty()) {
    AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
             "Missing name.");
  } else {
    for (int i = 0; i < name.size(); i++) {
      // I don't trust isalnum() due to locales.  :(
      if ((name[i] < 'a' || 'z' < name[i]) &&
          (name[i] < 'A' || 'Z' < name[i]) &&
          (name[i] < '0' || '9' < name[i]) &&
          (name[i] != '_')) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + name + "\" is not a valid identifier.");
      }
    }
  }
}